

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.h
# Opt level: O0

int __thiscall
CLogarithmicScrollbarScale::ToAbsolute
          (CLogarithmicScrollbarScale *this,float RelativeValue,int Min,int Max)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  __type _Var2;
  __type _Var3;
  __type _Var4;
  double dVar5;
  int ResultAdjustment;
  undefined4 local_18;
  
  local_18 = 0;
  if (in_ESI < *(int *)(in_RDI + 8)) {
    local_18 = -*(int *)(in_RDI + 8);
  }
  _Var2 = std::log<int>(0);
  _Var3 = std::log<int>(0);
  _Var4 = std::log<int>(0);
  dVar5 = exp((double)in_XMM0_Da * (_Var2 - _Var3) + _Var4);
  iVar1 = round_to_int((float)dVar5);
  return iVar1 + local_18;
}

Assistant:

int ToAbsolute(float RelativeValue, int Min, int Max) const
	{
		int ResultAdjustment = 0;
		if(Min < m_MinAdjustment)
		{
			Min += m_MinAdjustment;
			Max += m_MinAdjustment;
			ResultAdjustment = -m_MinAdjustment;
		}
		return round_to_int(exp(RelativeValue*(log(Max) - log(Min)) + log(Min))) + ResultAdjustment;
	}